

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

ps_config_t * ps_config_parse_json(ps_config_t *config,char *json)

{
  uint num_tokens;
  uint err;
  size_t sVar1;
  jsmntok_t *tokens;
  char *out;
  char *out_00;
  anytype_t *paVar2;
  char *fmt;
  long ln;
  ulong uVar3;
  ulong n_elem;
  int *piVar4;
  bool bVar5;
  ps_config_t *local_68;
  jsmn_parser parser;
  
  if (json == (char *)0x0) {
    return (ps_config_t *)0x0;
  }
  local_68 = config;
  if ((config == (ps_config_t *)0x0) &&
     (local_68 = ps_config_init((ps_arg_t *)0x0), local_68 == (ps_config_t *)0x0)) {
    return (ps_config_t *)0x0;
  }
  parser.pos = 0;
  parser.toknext = 0;
  parser.toksuper = -1;
  sVar1 = strlen(json);
  num_tokens = jsmn_parse(&parser,json,(long)(int)sVar1,(jsmntok_t *)0x0,0);
  if ((int)num_tokens < 1) {
    json_error(num_tokens);
  }
  else {
    parser.pos = 0;
    parser.toknext = 0;
    parser.toksuper = -1;
    n_elem = (ulong)num_tokens;
    tokens = (jsmntok_t *)
             __ckd_calloc__(n_elem,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                            ,0xf2);
    err = jsmn_parse(&parser,json,(long)(int)sVar1,tokens,num_tokens);
    if (err == num_tokens) {
      bVar5 = tokens->type == JSMN_OBJECT;
      uVar3 = (ulong)bVar5;
      piVar4 = &tokens[(ulong)bVar5 + 1].end;
      while( true ) {
        if (n_elem <= uVar3) {
          ckd_free((void *)0x0);
          ckd_free((void *)0x0);
          ckd_free(tokens);
          return local_68;
        }
        out = (char *)__ckd_malloc__((long)((piVar4[-4] - piVar4[-5]) + 1),
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                     ,0xfc);
        unescape(out,json + piVar4[-5],(long)piVar4[-4] - (long)piVar4[-5]);
        if ((piVar4[-6] != 4) && (piVar4[-6] != 8)) break;
        if (n_elem - 1 == uVar3) {
          fmt = "Missing value for %s\n";
          out_00 = (char *)0x0;
          ln = 0x103;
          goto LAB_00109a8b;
        }
        out_00 = (char *)__ckd_malloc__((long)((*piVar4 - piVar4[-1]) + 1),
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                        ,0x106);
        unescape(out_00,json + piVar4[-1],(long)*piVar4 - (long)piVar4[-1]);
        paVar2 = ps_config_set_str(local_68,out,out_00);
        if (paVar2 == (anytype_t *)0x0) {
          fmt = "Unknown or invalid parameter %s\n";
          ln = 0x109;
          goto LAB_00109a8b;
        }
        ckd_free(out);
        ckd_free(out_00);
        uVar3 = uVar3 + 2;
        piVar4 = piVar4 + 8;
      }
      fmt = "Expected string or primitive key, got %s\n";
      out_00 = (char *)0x0;
      ln = 0xff;
LAB_00109a8b:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
              ,ln,fmt,out);
      if (out != (char *)0x0) {
        ckd_free(out);
      }
      if (out_00 != (char *)0x0) {
        ckd_free(out_00);
      }
    }
    else {
      json_error(err);
      if (tokens == (jsmntok_t *)0x0) goto LAB_00109ac1;
    }
    ckd_free(tokens);
  }
LAB_00109ac1:
  if (config == (ps_config_t *)0x0) {
    ps_config_free(local_68);
  }
  return (ps_config_t *)0x0;
}

Assistant:

ps_config_t *
ps_config_parse_json(ps_config_t *config,
                     const char *json)
{
    jsmn_parser parser;
    jsmntok_t *tokens = NULL;
    char *key = NULL, *val = NULL;
    int i, jslen, ntok, new_config = FALSE;

    if (json == NULL)
        return NULL;
    if (config == NULL) {
        if ((config = ps_config_init(NULL)) == NULL)
            return NULL;
        new_config = TRUE;
    }
    jsmn_init(&parser);
    jslen = strlen(json);
    if ((ntok = jsmn_parse(&parser, json, jslen, NULL, 0)) <= 0) {
        json_error(ntok);
        goto error_out;
    }
    /* Need to reset the parser before second pass! */
    jsmn_init(&parser);
    tokens = ckd_calloc(ntok, sizeof(*tokens));
    if ((i = jsmn_parse(&parser, json, jslen, tokens, ntok)) != ntok) {
        json_error(i);
        goto error_out;
    }
    /* Accept missing top-level object. */
    i = 0;
    if (tokens[0].type == JSMN_OBJECT)
        ++i;
    while (i < ntok) {
        key = ckd_malloc(tokens[i].end - tokens[i].start + 1);
        unescape(key, json + tokens[i].start, tokens[i].end - tokens[i].start);
        if (tokens[i].type != JSMN_STRING && tokens[i].type != JSMN_PRIMITIVE) {
            E_ERROR("Expected string or primitive key, got %s\n", key);
            goto error_out;
        }
        if (++i == ntok) {
            E_ERROR("Missing value for %s\n", key);
            goto error_out;
        }
        val = ckd_malloc(tokens[i].end - tokens[i].start + 1);
        unescape(val, json + tokens[i].start, tokens[i].end - tokens[i].start);
        if (ps_config_set_str(config, key, val) == NULL) {
            E_ERROR("Unknown or invalid parameter %s\n", key);
            goto error_out;
        }
        ckd_free(key);
        ckd_free(val);
        key = val = NULL;
        ++i;
    }

    ckd_free(key);
    ckd_free(val);
    ckd_free(tokens);
    return config;

error_out:
    if (key)
        ckd_free(key);
    if (val)
        ckd_free(val);
    if (tokens)
        ckd_free(tokens);
    if (new_config)
        ps_config_free(config);
    return NULL;
}